

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall
JsonnetJsonValue::JsonnetJsonValue(JsonnetJsonValue *this,Kind kind,string *string,double number)

{
  _Rb_tree_header *p_Var1;
  
  this->kind = kind;
  std::__cxx11::string::string((string *)&this->string,(string *)string);
  this->number = number;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->fields)._M_t._M_impl.super__Rb_tree_header;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

JsonnetJsonValue(Kind kind, std::string string, double number)
        : kind(kind), string(string), number(number)
    {
    }